

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

int JS_ToInt32Free(JSContext *ctx,int32_t *pres,JSValue val)

{
  uint uVar1;
  int iVar2;
  uint in_ECX;
  undefined8 in_RDX;
  int *in_RSI;
  JSValue JVar3;
  uint64_t v;
  int e;
  double d;
  JSFloat64Union u;
  int32_t ret;
  uint32_t tag;
  undefined4 in_stack_ffffffffffffff98;
  JSValueUnion in_stack_ffffffffffffffa0;
  int local_30;
  int local_18;
  uint uStack_14;
  uint local_10;
  
  local_18 = (int)in_RDX;
  uStack_14 = (uint)((ulong)in_RDX >> 0x20);
  local_10 = in_ECX;
  do {
    if (local_10 < 4) {
      local_30 = local_18;
LAB_0013280b:
      *in_RSI = local_30;
      return 0;
    }
    if (local_10 == 7) {
      uVar1 = uStack_14 >> 0x14 & 0x7ff;
      if (uVar1 < 0x41e) {
        local_30 = (int)(double)CONCAT44(uStack_14,local_18);
      }
      else if (uVar1 < 0x453) {
        local_30 = (int)(((CONCAT44(uStack_14,local_18) & 0xfffffffffffff | 0x10000000000000) <<
                         ((char)uVar1 - 0x13U & 0x3f)) >> 0x20);
        if ((int)uStack_14 < 0) {
          local_30 = -local_30;
        }
      }
      else {
        local_30 = 0;
      }
      goto LAB_0013280b;
    }
    JVar3.u._4_4_ = local_10;
    JVar3.u.int32 = in_stack_ffffffffffffff98;
    JVar3.tag = (int64_t)in_stack_ffffffffffffffa0.ptr;
    JVar3 = JS_ToNumberFree((JSContext *)0x1327bf,JVar3);
    in_stack_ffffffffffffffa0 = JVar3.u;
    local_18 = JVar3.u._0_4_;
    uStack_14 = JVar3.u._4_4_;
    local_10 = (uint)JVar3.tag;
    iVar2 = JS_IsException(JVar3);
    if (iVar2 != 0) {
      *in_RSI = 0;
      return -1;
    }
  } while( true );
}

Assistant:

static int JS_ToInt32Free(JSContext *ctx, int32_t *pres, JSValue val)
{
    uint32_t tag;
    int32_t ret;

 redo:
    tag = JS_VALUE_GET_NORM_TAG(val);
    switch(tag) {
    case JS_TAG_INT:
    case JS_TAG_BOOL:
    case JS_TAG_NULL:
    case JS_TAG_UNDEFINED:
        ret = JS_VALUE_GET_INT(val);
        break;
    case JS_TAG_FLOAT64:
        {
            JSFloat64Union u;
            double d;
            int e;
            d = JS_VALUE_GET_FLOAT64(val);
            u.d = d;
            /* we avoid doing fmod(x, 2^32) */
            e = (u.u64 >> 52) & 0x7ff;
            if (likely(e <= (1023 + 30))) {
                /* fast case */
                ret = (int32_t)d;
            } else if (e <= (1023 + 30 + 53)) {
                uint64_t v;
                /* remainder modulo 2^32 */
                v = (u.u64 & (((uint64_t)1 << 52) - 1)) | ((uint64_t)1 << 52);
                v = v << ((e - 1023) - 52 + 32);
                ret = v >> 32;
                /* take the sign into account */
                if (u.u64 >> 63)
                    ret = -ret;
            } else {
                ret = 0; /* also handles NaN and +inf */
            }
        }
        break;
#ifdef CONFIG_BIGNUM
    case JS_TAG_BIG_FLOAT:
        {
            JSBigFloat *p = JS_VALUE_GET_PTR(val);
            bf_get_int32(&ret, &p->num, BF_GET_INT_MOD);
            JS_FreeValue(ctx, val);
        }
        break;
#endif
    default:
        val = JS_ToNumberFree(ctx, val);
        if (JS_IsException(val)) {
            *pres = 0;
            return -1;
        }
        goto redo;
    }
    *pres = ret;
    return 0;
}